

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Unsigned1(ByteCodeWriter *this,OpCode op,uint C1)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_2c [2];
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x4d);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x2a3,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TryWriteUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,C1);
  if (!bVar2) {
    bVar2 = TryWriteUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,C1);
    if (!bVar2) {
      local_2c[0] = C1;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
      Data::Write(&this->m_byteCodeData,local_2c,4);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::Unsigned1(OpCode op, uint C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(Unsigned1, op, C1);
    }